

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

float32 likelhddec(float32 *meana,float32 *vara,float32 *meanb,float32 *varb,float32 **cnta,
                  float32 **cntb,int32 ndensity,int32 nfeat,int32 dim,int32 continuous)

{
  double dVar1;
  undefined1 auVar2 [16];
  cmd_ln_t *cmdln;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float32 fVar8;
  float32 fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  double dVar14;
  double dVar15;
  undefined1 local_58 [32];
  double local_38;
  
  if (continuous == 0) {
    if (nfeat < 1) {
      fVar9 = 0.0;
    }
    else {
      uVar3 = 0;
      fVar9 = 0.0;
      do {
        local_38 = 0.0;
        if (ndensity < 1) {
          dVar14 = 0.0;
          fVar10 = 0.0;
          fVar7 = 0.0;
          dVar15 = 0.0;
        }
        else {
          fVar7 = 0.0;
          uVar4 = 0;
          auVar2._12_4_ = 0;
          auVar2._0_12_ = local_58._4_12_;
          local_58._0_16_ = auVar2 << 0x20;
          do {
            fVar10 = (float)cnta[uVar3][uVar4];
            fVar11 = (float)cntb[uVar3][uVar4];
            dVar14 = 0.0;
            if ((fVar10 != 0.0) || (fVar8 = (float32)fVar11, NAN(fVar10))) {
              dVar14 = log((double)fVar10);
              dVar14 = dVar14 * (double)fVar10;
              fVar8 = cntb[uVar3][uVar4];
            }
            dVar15 = 0.0;
            if (((float)fVar8 != 0.0) || (NAN((float)fVar8))) {
              dVar15 = log((double)(float)fVar8);
              dVar15 = dVar15 * (double)(float)fVar8;
              fVar8 = cntb[uVar3][uVar4];
            }
            fVar12 = (float)fVar8 + (float)cnta[uVar3][uVar4];
            dVar1 = 0.0;
            if ((fVar12 != 0.0) || (NAN(fVar12))) {
              dVar1 = log((double)fVar12);
              dVar1 = dVar1 * (double)fVar12;
            }
            fVar10 = (float)local_58._0_4_ + fVar10;
            local_58._0_4_ = fVar10;
            fVar7 = fVar7 + fVar11;
            fVar9 = (float32)(float)((double)(float)fVar9 + ((dVar14 + dVar15) - dVar1));
            uVar4 = uVar4 + 1;
          } while ((uint)ndensity != uVar4);
          dVar14 = 0.0;
          if ((fVar10 != 0.0) || (NAN(fVar10))) {
            dVar14 = log((double)fVar10);
            dVar14 = dVar14 * (double)fVar10;
          }
          dVar15 = 0.0;
          if ((fVar7 != 0.0) || (NAN(fVar7))) {
            dVar15 = log((double)fVar7);
            dVar15 = dVar15 * (double)fVar7;
          }
        }
        fVar10 = fVar10 + fVar7;
        if ((fVar10 != 0.0) || (NAN(fVar10))) {
          dVar1 = (double)fVar10;
          local_58._0_8_ = dVar1;
          local_38 = log(dVar1);
          local_38 = local_38 * dVar1;
        }
        fVar9 = (float32)(float)((double)(float)fVar9 - ((dVar14 + dVar15) - local_38));
        uVar3 = uVar3 + 1;
      } while (uVar3 != (uint)nfeat);
    }
  }
  else {
    cmdln = cmd_ln_get();
    dVar14 = cmd_ln_float_r(cmdln,"-varfloor");
    fVar8 = **cnta;
    fVar9 = **cntb;
    fVar10 = (float)fVar8 + (float)fVar9;
    if (dim < 1) {
      fVar11 = 0.0;
      fVar12 = 0.0;
      fVar7 = 0.0;
    }
    else {
      fVar11 = 0.0;
      fVar12 = 0.0;
      fVar7 = 0.0;
      uVar3 = 0;
      do {
        fVar6 = (float)meana[uVar3];
        fVar5 = (float)meanb[uVar3];
        fVar13 = ((float)**cnta * fVar6 + (float)**cntb * fVar5) / fVar10;
        fVar5 = ((fVar6 * fVar6 + (float)vara[uVar3]) * (float)**cnta +
                (fVar5 * fVar5 + (float)varb[uVar3]) * (float)**cntb) / fVar10 - fVar13 * fVar13;
        fVar6 = (float)dVar14;
        if ((float)dVar14 <= fVar5) {
          fVar6 = fVar5;
        }
        dVar15 = log((double)fVar6);
        dVar1 = log((double)(float)varb[uVar3]);
        fVar7 = fVar7 + (float)dVar1;
        dVar1 = log((double)(float)vara[uVar3]);
        fVar11 = fVar11 + (float)dVar15;
        fVar12 = fVar12 + (float)dVar1;
        uVar3 = uVar3 + 1;
      } while ((uint)dim != uVar3);
      fVar9 = **cntb;
      fVar8 = **cnta;
    }
    fVar9 = (float32)(((fVar10 * fVar11 - (float)fVar9 * fVar7) - fVar12 * (float)fVar8) * 0.5);
  }
  return fVar9;
}

Assistant:

float32    likelhddec(float32 *meana, float32 *vara,
                      float32 *meanb, float32 *varb,
                      float32 **cnta, float32 **cntb,
                      int32 ndensity, int32 nfeat, int32 dim, int32 continuous)
{
    int32   i;
    float32 cntc, la, lb, lc, nm, nv, lkdec, minvar;

    if (continuous) {
        minvar = cmd_ln_float32("-varfloor");
        cntc = cnta[0][0] + cntb[0][0];

        for (i=0, lc=0, lb=0, la=0;i<dim;i++){
            nm = (cnta[0][0]*meana[i] + cntb[0][0]*meanb[i])/cntc;
            nv = cnta[0][0]*(vara[i]+meana[i]*meana[i])+
                 cntb[0][0]*(varb[i]+meanb[i]*meanb[i]);
            nv = nv/cntc - nm*nm;
            if (nv < minvar) nv = minvar;
            lc += (float32)log(nv);
            lb += (float32)log(varb[i]);
            la += (float32)log(vara[i]);
        }
        lkdec = 0.5*(cntc*lc - cntb[0][0]*lb - cnta[0][0]*la);
    }
    else {
        int32 j;
        float32 P,Q;
        for (i=0,lkdec = 0; i < nfeat; i++) {
            for (j=0,P=0,Q=0; j < ndensity; j++) {
                P += cnta[i][j]; Q += cntb[i][j];
                lkdec += ((cnta[i][j]==0) ? 0 : cnta[i][j]*log(cnta[i][j]))
		       + ((cntb[i][j]==0) ? 0 : cntb[i][j]*log(cntb[i][j]))
		       - (((cnta[i][j]+cntb[i][j])==0) ? 0 : 
			  (cnta[i][j]+cntb[i][j])*log(cnta[i][j]+cntb[i][j]));
            }
            lkdec -= 
		((P==0) ? 0 : (P*log(P))) +
		((Q==0) ? 0 : (Q*log(Q))) -
		(((P+Q)==0) ? 0 : ((P+Q)*log(P+Q)));
        }
#if 0
        /* The old code, assumed log(0) would give a reasonable answer */
	for (i=0,lkdec = 0; i < nfeat; i++) {
            for (j=0,P=0,Q=0; j < ndensity; j++) {
                P += cnta[i][j]; Q += cntb[i][j];
                lkdec += cnta[i][j]*log(cnta[i][j]) + cntb[i][j]*log(cntb[i][j])
                           -(cnta[i][j]+cntb[i][j])*log(cnta[i][j]+cntb[i][j]);
            }
            lkdec -= P*log(P) + Q*log(Q) - (P+Q)*log(P+Q);
        }
#endif 
    }

    return(lkdec);
}